

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O0

HiRep * __thiscall absl::lts_20250127::Duration::HiRep::operator=(HiRep *this,int64_t value)

{
  uint64_t unsigned_value;
  int64_t value_local;
  HiRep *this_local;
  
  this->lo_ = (int)value;
  this->hi_ = (int)((ulong)value >> 0x20);
  return this;
}

Assistant:

constexpr HiRep& operator=(const int64_t value) {
      // "If the destination type is unsigned, the resulting value is the
      // smallest unsigned value equal to the source value modulo 2^n
      // where `n` is the number of bits used to represent the destination
      // type".
      const auto unsigned_value = static_cast<uint64_t>(value);
      hi_ = static_cast<uint32_t>(unsigned_value >> 32);
      lo_ = static_cast<uint32_t>(unsigned_value);
      return *this;
    }